

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O0

int tinf_inflate_block_data(tinf_data *d,tinf_tree *lt,tinf_tree *dt)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int local_3c;
  int i;
  int offs;
  int dist;
  int length;
  int sym;
  tinf_tree *dt_local;
  tinf_tree *lt_local;
  tinf_data *d_local;
  
  while( true ) {
    while( true ) {
      iVar2 = tinf_decode_symbol(d,lt);
      if (d->overflow != 0) {
        return -3;
      }
      if (0xff < iVar2) break;
      if (d->dest == d->dest_end) {
        return -5;
      }
      puVar1 = d->dest;
      d->dest = puVar1 + 1;
      *puVar1 = (uchar)iVar2;
    }
    if (iVar2 == 0x100) {
      return 0;
    }
    if (((lt->max_sym < iVar2) || (0x1c < iVar2 + -0x101)) || (dt->max_sym == -1)) {
      return -3;
    }
    uVar3 = tinf_getbits_base(d,(uint)""[iVar2 + -0x101],
                              (uint)tinf_inflate_block_data::length_base[iVar2 + -0x101]);
    iVar2 = tinf_decode_symbol(d,dt);
    if ((dt->max_sym < iVar2) || (0x1d < iVar2)) {
      return -3;
    }
    uVar4 = tinf_getbits_base(d,(uint)""[iVar2],(uint)tinf_inflate_block_data::dist_base[iVar2]);
    if ((long)d->dest - (long)d->dest_start < (long)(int)uVar4) {
      return -3;
    }
    if ((long)d->dest_end - (long)d->dest < (long)(int)uVar3) break;
    for (local_3c = 0; local_3c < (int)uVar3; local_3c = local_3c + 1) {
      d->dest[local_3c] = d->dest[(int)(local_3c - uVar4)];
    }
    d->dest = d->dest + (int)uVar3;
  }
  return -5;
}

Assistant:

static int tinf_inflate_block_data(struct tinf_data *d, struct tinf_tree *lt,
                                   struct tinf_tree *dt)
{
	/* Extra bits and base tables for length codes */
	static const unsigned char length_bits[30] = {
		0, 0, 0, 0, 0, 0, 0, 0, 1, 1,
		1, 1, 2, 2, 2, 2, 3, 3, 3, 3,
		4, 4, 4, 4, 5, 5, 5, 5, 0, 127
	};

	static const unsigned short length_base[30] = {
		 3,  4,  5,   6,   7,   8,   9,  10,  11,  13,
		15, 17, 19,  23,  27,  31,  35,  43,  51,  59,
		67, 83, 99, 115, 131, 163, 195, 227, 258,   0
	};

	/* Extra bits and base tables for distance codes */
	static const unsigned char dist_bits[30] = {
		0, 0,  0,  0,  1,  1,  2,  2,  3,  3,
		4, 4,  5,  5,  6,  6,  7,  7,  8,  8,
		9, 9, 10, 10, 11, 11, 12, 12, 13, 13
	};

	static const unsigned short dist_base[30] = {
		   1,    2,    3,    4,    5,    7,    9,    13,    17,    25,
		  33,   49,   65,   97,  129,  193,  257,   385,   513,   769,
		1025, 1537, 2049, 3073, 4097, 6145, 8193, 12289, 16385, 24577
	};

	for (;;) {
		int sym = tinf_decode_symbol(d, lt);

		/* Check for overflow in bit reader */
		if (d->overflow) {
			return TINF_DATA_ERROR;
		}

		if (sym < 256) {
			if (d->dest == d->dest_end) {
				return TINF_BUF_ERROR;
			}
			*d->dest++ = sym;
		}
		else {
			int length, dist, offs;
			int i;

			/* Check for end of block */
			if (sym == 256) {
				return TINF_OK;
			}

			/* Check sym is within range and distance tree is not empty */
			if (sym > lt->max_sym || sym - 257 > 28 || dt->max_sym == -1) {
				return TINF_DATA_ERROR;
			}

			sym -= 257;

			/* Possibly get more bits from length code */
			length = tinf_getbits_base(d, length_bits[sym],
			                           length_base[sym]);

			dist = tinf_decode_symbol(d, dt);

			/* Check dist is within range */
			if (dist > dt->max_sym || dist > 29) {
				return TINF_DATA_ERROR;
			}

			/* Possibly get more bits from distance code */
			offs = tinf_getbits_base(d, dist_bits[dist],
			                         dist_base[dist]);

			if (offs > d->dest - d->dest_start) {
				return TINF_DATA_ERROR;
			}

			if (d->dest_end - d->dest < length) {
				return TINF_BUF_ERROR;
			}

			/* Copy match */
			for (i = 0; i < length; ++i) {
				d->dest[i] = d->dest[i - offs];
			}

			d->dest += length;
		}
	}
}